

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O1

void Gia_ManInseFindStarting(Gia_Man_t *p,int iPat,Vec_Int_t *vInit,Vec_Int_t *vInputs)

{
  void *pvVar1;
  long lVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  
  vInit->nSize = 0;
  iVar4 = p->nRegs;
  iVar5 = iPat >> 5;
  if (0 < iVar4) {
    uVar12 = 1 << ((byte)iPat & 0x1f);
    iVar8 = 0;
    do {
      iVar9 = p->vCos->nSize;
      uVar6 = (iVar9 - iVar4) + iVar8;
      if (((int)uVar6 < 0) || (iVar9 <= (int)uVar6)) goto LAB_00597ff2;
      iVar4 = p->vCos->pArray[uVar6];
      if ((iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00597fd3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      lVar2 = (long)p->iData;
      iVar4 = iVar4 * p->iData;
      pvVar1 = p->pData;
      lVar13 = lVar2 * 8 + (long)(iVar4 * 2) * 8;
      if (0 < lVar2) {
        lVar10 = 0;
        do {
          if ((*(ulong *)((long)pvVar1 + lVar10 * 8 + (long)(iVar4 * 2) * 8) &
              *(ulong *)((long)pvVar1 + lVar10 * 8 + lVar13)) != 0) {
            __assert_fail("(pData0[i] & pData1[i]) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                          ,0xd1,
                          "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          lVar10 = lVar10 + 1;
        } while (lVar2 != lVar10);
      }
      iVar9 = 0;
      if ((*(uint *)((long)pvVar1 + (long)iVar5 * 4 + (long)(iVar4 * 2) * 8) & uVar12) == 0) {
        iVar9 = ((*(uint *)((long)pvVar1 + (long)iVar5 * 4 + lVar13) & uVar12) == 0) + 1;
      }
      Vec_IntPush(vInit,iVar9);
      iVar8 = iVar8 + 1;
      iVar4 = p->nRegs;
    } while (iVar8 < iVar4);
  }
  pVVar3 = p->vCis;
  uVar7 = (ulong)(uint)pVVar3->nSize;
  if (p->nRegs < pVVar3->nSize) {
    uVar12 = 1 << ((byte)iPat & 0x1f);
    lVar13 = 0;
    do {
      if ((int)uVar7 <= lVar13) {
LAB_00597ff2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar3->pArray[lVar13];
      if ((iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00597fd3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar10 = (long)p->iData;
      iVar4 = iVar4 * p->iData;
      pvVar1 = p->pData;
      lVar2 = lVar10 * 8 + (long)(iVar4 * 2) * 8;
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          if ((*(ulong *)((long)pvVar1 + lVar11 * 8 + (long)(iVar4 * 2) * 8) &
              *(ulong *)((long)pvVar1 + lVar11 * 8 + lVar2)) != 0) {
            __assert_fail("(pData0[i] & pData1[i]) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                          ,0xde,
                          "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      iVar8 = 0;
      if ((*(uint *)((long)pvVar1 + (long)iVar5 * 4 + (long)(iVar4 * 2) * 8) & uVar12) == 0) {
        iVar8 = ((*(uint *)((long)pvVar1 + (long)iVar5 * 4 + lVar2) & uVar12) == 0) + 1;
      }
      Vec_IntPush(vInputs,iVar8);
      lVar13 = lVar13 + 1;
      pVVar3 = p->vCis;
      uVar7 = (ulong)pVVar3->nSize;
    } while (lVar13 < (long)(uVar7 - (long)p->nRegs));
  }
  return;
}

Assistant:

void Gia_ManInseFindStarting( Gia_Man_t * p, int iPat, Vec_Int_t * vInit, Vec_Int_t * vInputs )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int i, k;
    Vec_IntClear( vInit );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInit, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInit, 1 );
        else 
            Vec_IntPush( vInit, 2 );
    }
    Gia_ManForEachPi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInputs, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInputs, 1 );
        else 
            Vec_IntPush( vInputs, 2 );
    }
}